

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Minefield_Query_PDU::SetSensorTypes
          (Minefield_Query_PDU *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *ST)

{
  KUINT16 *pKVar1;
  ulong uVar2;
  KUINT16 KVar3;
  
  pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (ushort)this->m_ui8NumSensTyp * -2;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
            (&this->m_vui16SensorTypes,ST);
  uVar2 = (long)(this->m_vui16SensorTypes).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_vui16SensorTypes).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start >> 1;
  this->m_ui8NumSensTyp = (KUINT8)uVar2;
  KVar3 = ((ushort)uVar2 & 0xff) * 2 +
          (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = KVar3;
  if (this->m_bNeedsPadding == true) {
    (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = KVar3 - 2;
  }
  if ((uVar2 & 1) == 0) {
    this->m_bNeedsPadding = false;
  }
  else {
    this->m_bNeedsPadding = true;
    pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 2;
  }
  return;
}

Assistant:

void Minefield_Query_PDU::SetSensorTypes( const vector<KUINT16> & ST )
{
    // Subtract old values from pdu length.
    m_ui16PDULength -= m_ui8NumSensTyp * 2; // 2 = size of sensor type.

    m_vui16SensorTypes = ST;
    m_ui8NumSensTyp = m_vui16SensorTypes.size();

    // Calculate the new size
    m_ui16PDULength += m_ui8NumSensTyp * 2;
    calcPadding();
}